

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

void __thiscall
CorUnix::CThreadSynchronizationInfo::CThreadSynchronizationInfo(CThreadSynchronizationInfo *this)

{
  (this->super_CThreadInfoInitializer)._vptr_CThreadInfoInitializer =
       (_func_int **)&PTR_InitializePreCreate_014d7db0;
  this->m_tsThreadState = TS_IDLE;
  this->m_shridWaitAwakened = 0;
  (this->m_lLocalSynchLockCount).m_val = 0;
  (this->m_lSharedSynchLockCount).m_val = 0;
  (this->m_tnwdNativeData).iPred = 0;
  (this->m_tnwdNativeData).dwObjectIndex = 0;
  (this->m_tnwdNativeData).twrWakeupReason = WaitSucceeded;
  (this->m_tnwdNativeData).fInitialized = false;
  (this->m_twiWaitInfo).wtWaitType = SingleObject;
  (this->m_twiWaitInfo).wdWaitDomain = LocalWait;
  (this->m_twiWaitInfo).lObjCount = 0;
  (this->m_twiWaitInfo).lSharedObjCount = 0;
  (this->m_twiWaitInfo).pthrOwner = (CPalThread *)0x0;
  (this->m_leOwnedObjsList).Blink = &this->m_leOwnedObjsList;
  (this->m_leOwnedObjsList).Flink = &this->m_leOwnedObjsList;
  this->m_lPendingSignalingCount = 0;
  (this->m_lePendingSignalingsOverflowList).Blink = &this->m_lePendingSignalingsOverflowList;
  (this->m_lePendingSignalingsOverflowList).Flink = &this->m_lePendingSignalingsOverflowList;
  return;
}

Assistant:

CThreadSynchronizationInfo::CThreadSynchronizationInfo() :
            m_tsThreadState(TS_IDLE),
            m_shridWaitAwakened(NULLSharedID),
            m_lLocalSynchLockCount(0),
            m_lSharedSynchLockCount(0)
    {
        InitializeListHead(&m_leOwnedObjsList);

#ifdef SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING
        m_lPendingSignalingCount = 0;
        InitializeListHead(&m_lePendingSignalingsOverflowList);
#endif // SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING
    }